

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QRegionPrivate * qt_bitmapToRegion(QBitmap *bitmap)

{
  Format FVar1;
  int iVar2;
  QRegionPrivate *pQVar3;
  QPixmap *pQVar4;
  long in_FS_OFFSET;
  int b_1;
  int b;
  uchar byte;
  int prev1;
  uchar all;
  int w;
  uchar *line;
  int y;
  int x;
  bool little;
  uchar zero;
  QRegionPrivate *region;
  QRect xr;
  QImage image;
  QRegionPrivate *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  undefined2 in_stack_ffffffffffffff74;
  undefined1 in_stack_ffffffffffffff76;
  undefined1 in_stack_ffffffffffffff77;
  QPixmap *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar5;
  int local_70;
  int local_6c;
  byte local_65;
  byte local_5d;
  int local_4c;
  int local_48;
  undefined1 local_20 [16];
  QImageData *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  QPixmap::toImage(in_stack_ffffffffffffff78);
  pQVar3 = (QRegionPrivate *)operator_new(0x40);
  QRegionPrivate::QRegionPrivate
            ((QRegionPrivate *)
             CONCAT17(in_stack_ffffffffffffff77,
                      CONCAT16(in_stack_ffffffffffffff76,
                               CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))));
  QRect::QRect((QRect *)CONCAT17(in_stack_ffffffffffffff77,
                                 CONCAT16(in_stack_ffffffffffffff76,
                                          CONCAT24(in_stack_ffffffffffffff74,
                                                   in_stack_ffffffffffffff70))));
  FVar1 = QImage::format((QImage *)local_20);
  local_4c = 0;
  while (iVar5 = local_4c, iVar2 = QImage::height((QImage *)local_20), iVar5 < iVar2) {
    pQVar4 = (QPixmap *)QImage::constScanLine((QImage *)local_20,local_4c);
    iVar2 = QImage::width((QImage *)local_20);
    local_5d = 0;
    local_48 = 0;
    while (local_48 < iVar2) {
      local_65 = *(byte *)((long)&(pQVar4->super_QPaintDevice)._vptr_QPaintDevice +
                          (long)(local_48 / 8));
      in_stack_ffffffffffffff78 = pQVar4;
      if ((iVar2 + -8 < local_48) || (local_65 != local_5d)) {
        if (FVar1 == Format_MonoLSB) {
          for (local_6c = 8; in_stack_ffffffffffffff77 = 0 < local_6c && local_48 < iVar2,
              0 < local_6c && local_48 < iVar2; local_6c = local_6c + -1) {
            if (((local_65 & 1) == 0) != (local_5d == 0)) {
              if (local_5d == 0) {
                local_5d = 0xff;
              }
              else {
                QRect::setCoords((QRect *)CONCAT44(iVar5,in_stack_ffffffffffffff80),
                                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                 (int)in_stack_ffffffffffffff78,
                                 CONCAT13(in_stack_ffffffffffffff77,
                                          CONCAT12(in_stack_ffffffffffffff76,
                                                   in_stack_ffffffffffffff74)),
                                 in_stack_ffffffffffffff70);
                UnionRectWithRegion((QRect *)in_stack_ffffffffffffff78,
                                    (QRegionPrivate *)
                                    CONCAT17(in_stack_ffffffffffffff77,
                                             CONCAT16(in_stack_ffffffffffffff76,
                                                      CONCAT24(in_stack_ffffffffffffff74,
                                                               in_stack_ffffffffffffff70))),
                                    in_stack_ffffffffffffff68);
                local_5d = 0;
              }
            }
            local_65 = (byte)((int)(uint)local_65 >> 1);
            local_48 = local_48 + 1;
          }
        }
        else {
          for (local_70 = 8; in_stack_ffffffffffffff76 = 0 < local_70 && local_48 < iVar2,
              0 < local_70 && local_48 < iVar2; local_70 = local_70 + -1) {
            if (((local_65 & 0x80) == 0) != (local_5d == 0)) {
              if (local_5d == 0) {
                local_5d = 0xff;
              }
              else {
                QRect::setCoords((QRect *)CONCAT44(iVar5,in_stack_ffffffffffffff80),
                                 (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                 (int)in_stack_ffffffffffffff78,
                                 CONCAT13(in_stack_ffffffffffffff77,
                                          CONCAT12(in_stack_ffffffffffffff76,
                                                   in_stack_ffffffffffffff74)),
                                 in_stack_ffffffffffffff70);
                UnionRectWithRegion((QRect *)in_stack_ffffffffffffff78,
                                    (QRegionPrivate *)
                                    CONCAT17(in_stack_ffffffffffffff77,
                                             CONCAT16(in_stack_ffffffffffffff76,
                                                      CONCAT24(in_stack_ffffffffffffff74,
                                                               in_stack_ffffffffffffff70))),
                                    in_stack_ffffffffffffff68);
                local_5d = 0;
              }
            }
            local_65 = local_65 << 1;
            local_48 = local_48 + 1;
          }
        }
      }
      else {
        local_48 = local_48 + 8;
      }
    }
    if (local_5d != 0) {
      QRect::setCoords((QRect *)CONCAT44(iVar5,in_stack_ffffffffffffff80),
                       (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                       (int)in_stack_ffffffffffffff78,
                       CONCAT13(in_stack_ffffffffffffff77,
                                CONCAT12(in_stack_ffffffffffffff76,in_stack_ffffffffffffff74)),
                       in_stack_ffffffffffffff70);
      UnionRectWithRegion((QRect *)in_stack_ffffffffffffff78,
                          (QRegionPrivate *)
                          CONCAT17(in_stack_ffffffffffffff77,
                                   CONCAT16(in_stack_ffffffffffffff76,
                                            CONCAT24(in_stack_ffffffffffffff74,
                                                     in_stack_ffffffffffffff70))),
                          in_stack_ffffffffffffff68);
    }
    local_4c = local_4c + 1;
  }
  QImage::~QImage((QImage *)
                  CONCAT17(in_stack_ffffffffffffff77,
                           CONCAT16(in_stack_ffffffffffffff76,
                                    CONCAT24(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))))
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRegionPrivate *qt_bitmapToRegion(const QBitmap& bitmap)
{
    const QImage image = bitmap.toImage();

    QRegionPrivate *region = new QRegionPrivate;

    QRect xr;

#define AddSpan \
        { \
            xr.setCoords(prev1, y, x-1, y); \
            UnionRectWithRegion(&xr, region, *region); \
        }

    const uchar zero = 0;
    bool little = image.format() == QImage::Format_MonoLSB;

    int x,
        y;
    for (y = 0; y < image.height(); ++y) {
        const uchar *line = image.constScanLine(y);
        int w = image.width();
        uchar all = zero;
        int prev1 = -1;
        for (x = 0; x < w;) {
            uchar byte = line[x / 8];
            if (x > w - 8 || byte!=all) {
                if (little) {
                    for (int b = 8; b > 0 && x < w; --b) {
                        if (!(byte & 0x01) == !all) {
                            // More of the same
                        } else {
                            // A change.
                            if (all!=zero) {
                                AddSpan
                                all = zero;
                            } else {
                                prev1 = x;
                                all = ~zero;
                            }
                        }
                        byte >>= 1;
                        ++x;
                    }
                } else {
                    for (int b = 8; b > 0 && x < w; --b) {
                        if (!(byte & 0x80) == !all) {
                            // More of the same
                        } else {
                            // A change.
                            if (all != zero) {
                                AddSpan
                                all = zero;
                            } else {
                                prev1 = x;
                                all = ~zero;
                            }
                        }
                        byte <<= 1;
                        ++x;
                    }
                }
            } else {
                x += 8;
            }
        }
        if (all != zero) {
            AddSpan
        }
    }
#undef AddSpan

    return region;
}